

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  long lVar5;
  long lVar6;
  PrimRefMB *pPVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  ulong uVar16;
  ulong uVar17;
  size_t itime;
  ulong uVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar36;
  float fVar37;
  undefined1 auVar35 [16];
  float fVar38;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [64];
  undefined1 auVar50 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar51;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar52;
  undefined1 auVar53 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar54;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar55;
  undefined1 auVar56 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  undefined1 auVar58 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar59;
  undefined1 auVar60 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong local_218;
  unsigned_long local_1f0;
  size_t local_1e8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  anon_class_16_2_07cfa4d6 local_160;
  ulong local_150;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_148;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar15;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar21 = r->_begin;
  uVar15 = r->_end;
  if (uVar21 < uVar15) {
    local_1a8 = SUB6416(ZEXT464(0x3f800000),0);
    local_1b8 = ZEXT816(0x3f80000000000000);
    auVar33._8_4_ = 0xff800000;
    auVar33._0_8_ = 0xff800000ff800000;
    auVar33._12_4_ = 0xff800000;
    auVar46 = ZEXT1664(auVar33);
    auVar30._8_4_ = 0x7f800000;
    auVar30._0_8_ = 0x7f8000007f800000;
    auVar30._12_4_ = 0x7f800000;
    auVar50 = ZEXT1664(auVar30);
    local_1f0 = 0;
    auVar60 = ZEXT1664(auVar30);
    auVar58 = ZEXT1664(auVar33);
    auVar53 = ZEXT1664(auVar30);
    auVar56 = ZEXT1664(auVar33);
    local_1e8 = 0;
    local_218 = 0;
    do {
      BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .super_Geometry.time_range;
      auVar25._8_8_ = 0;
      auVar25._0_4_ = BVar2.lower;
      auVar25._4_4_ = BVar2.upper;
      auVar33 = vmovshdup_avx(auVar25);
      fVar23 = BVar2.lower;
      fVar24 = auVar33._0_4_ - fVar23;
      uVar14 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>
                                   ).super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.field_0x68 * uVar21);
      uVar16 = (ulong)uVar14;
      uVar17 = (ulong)(uVar14 + 1);
      pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      if (uVar17 < (pBVar3->super_RawBufferView).num) {
        fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.fnumTimeSegments;
        auVar33 = ZEXT416((uint)(fVar1 * ((t0t1->lower - fVar23) / fVar24) * 1.0000002));
        auVar33 = vroundss_avx(auVar33,auVar33,9);
        auVar33 = vmaxss_avx(ZEXT816(0),auVar33);
        auVar30 = ZEXT416((uint)(fVar1 * ((t0t1->upper - fVar23) / fVar24) * 0.99999976));
        auVar30 = vroundss_avx(auVar30,auVar30,10);
        auVar30 = vminss_avx(auVar30,ZEXT416((uint)fVar1));
        if ((uint)(int)auVar33._0_4_ <= (uint)(int)auVar30._0_4_) {
          uVar18 = (ulong)(int)auVar33._0_4_;
          pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.tangents.items;
          lVar19 = uVar18 * 0x38 + 0x10;
          do {
            lVar5 = *(long *)((long)pBVar3 + lVar19 + -0x10);
            lVar6 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar19);
            auVar33 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar16);
            auVar44._8_4_ = 0xddccb9a2;
            auVar44._0_8_ = 0xddccb9a2ddccb9a2;
            auVar44._12_4_ = 0xddccb9a2;
            auVar25 = vcmpps_avx(auVar33,auVar44,2);
            auVar40._8_4_ = 0x5dccb9a2;
            auVar40._0_8_ = 0x5dccb9a25dccb9a2;
            auVar40._12_4_ = 0x5dccb9a2;
            auVar33 = vcmpps_avx(auVar33,auVar40,5);
            auVar33 = vorps_avx(auVar25,auVar33);
            if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar33[0xf] < '\0') goto LAB_0122556c;
            auVar33 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar17);
            auVar25 = vcmpps_avx(auVar33,auVar44,2);
            auVar33 = vcmpps_avx(auVar33,auVar40,5);
            auVar33 = vorps_avx(auVar25,auVar33);
            if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar33[0xf] < '\0') goto LAB_0122556c;
            lVar5 = *(long *)((long)pBVar4 + lVar19 + -0x10);
            lVar6 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar19);
            auVar33 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar16);
            auVar25 = vcmpps_avx(auVar33,auVar44,2);
            auVar33 = vcmpps_avx(auVar33,auVar40,5);
            auVar33 = vorps_avx(auVar25,auVar33);
            if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar33[0xf] < '\0') goto LAB_0122556c;
            auVar33 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar17);
            auVar25 = vcmpps_avx(auVar33,auVar44,2);
            auVar33 = vcmpps_avx(auVar33,auVar40,5);
            auVar33 = vorps_avx(auVar25,auVar33);
            if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar33[0xf] < '\0') goto LAB_0122556c;
            uVar18 = uVar18 + 1;
            lVar19 = lVar19 + 0x38;
          } while (uVar18 <= (ulong)(long)(int)auVar30._0_4_);
        }
        local_108 = auVar60._0_16_;
        local_f8 = auVar58._0_16_;
        local_e8 = auVar56._0_16_;
        local_d8 = auVar53._0_16_;
        local_c8 = auVar50._0_16_;
        local_b8 = auVar46._0_16_;
        fVar29 = (t0t1->lower - fVar23) / fVar24;
        fVar24 = (t0t1->upper - fVar23) / fVar24;
        fVar23 = fVar1 * fVar29;
        fVar34 = fVar1 * fVar24;
        auVar25 = vroundss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),9);
        auVar40 = vroundss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),10);
        auVar33 = vmaxss_avx(auVar25,ZEXT816(0));
        auVar30 = vminss_avx(auVar40,ZEXT416((uint)fVar1));
        iVar20 = (int)auVar33._0_4_;
        fVar28 = auVar30._0_4_;
        local_160.primID = &local_150;
        uVar14 = (int)auVar25._0_4_;
        if ((int)auVar25._0_4_ < 0) {
          uVar14 = 0xffffffff;
        }
        iVar22 = (int)fVar1 + 1;
        if ((int)auVar40._0_4_ < (int)fVar1 + 1) {
          iVar22 = (int)auVar40._0_4_;
        }
        local_160.this =
             (CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
              *)this;
        local_150 = uVar21;
        ::anon_func::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_128.field_1,&local_160,(long)iVar20);
        ::anon_func::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_148.field_1,&local_160,(long)(int)fVar28);
        fVar23 = fVar23 - auVar33._0_4_;
        if (iVar22 - uVar14 == 1) {
          auVar33 = vmaxss_avx(ZEXT416((uint)fVar23),ZEXT816(0) << 0x40);
          auVar30 = vshufps_avx(auVar33,auVar33,0);
          auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
          auVar33 = vshufps_avx(auVar33,auVar33,0);
          auVar45._0_4_ = auVar30._0_4_ * local_148.m128[0] + auVar33._0_4_ * local_128.m128[0];
          auVar45._4_4_ = auVar30._4_4_ * local_148.m128[1] + auVar33._4_4_ * local_128.m128[1];
          auVar45._8_4_ = auVar30._8_4_ * local_148.m128[2] + auVar33._8_4_ * local_128.m128[2];
          auVar45._12_4_ = auVar30._12_4_ * local_148.m128[3] + auVar33._12_4_ * local_128.m128[3];
          auVar39._0_4_ = auVar30._0_4_ * local_138 + auVar33._0_4_ * local_118;
          auVar39._4_4_ = auVar30._4_4_ * fStack_134 + auVar33._4_4_ * fStack_114;
          auVar39._8_4_ = auVar30._8_4_ * fStack_130 + auVar33._8_4_ * fStack_110;
          auVar39._12_4_ = auVar30._12_4_ * fStack_12c + auVar33._12_4_ * fStack_10c;
          auVar33 = vmaxss_avx(ZEXT416((uint)(fVar28 - fVar34)),ZEXT816(0) << 0x40);
          auVar30 = vshufps_avx(auVar33,auVar33,0);
          auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
          auVar33 = vshufps_avx(auVar33,auVar33,0);
          auVar31._0_4_ = auVar33._0_4_ * local_148.m128[0] + auVar30._0_4_ * local_128.m128[0];
          auVar31._4_4_ = auVar33._4_4_ * local_148.m128[1] + auVar30._4_4_ * local_128.m128[1];
          auVar31._8_4_ = auVar33._8_4_ * local_148.m128[2] + auVar30._8_4_ * local_128.m128[2];
          auVar31._12_4_ = auVar33._12_4_ * local_148.m128[3] + auVar30._12_4_ * local_128.m128[3];
          auVar35._0_4_ = auVar33._0_4_ * local_138 + auVar30._0_4_ * local_118;
          auVar35._4_4_ = auVar33._4_4_ * fStack_134 + auVar30._4_4_ * fStack_114;
          auVar35._8_4_ = auVar33._8_4_ * fStack_130 + auVar30._8_4_ * fStack_110;
          auVar35._12_4_ = auVar33._12_4_ * fStack_12c + auVar30._12_4_ * fStack_10c;
        }
        else {
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_160,(long)(iVar20 + 1));
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_160,(long)((int)fVar28 + -1));
          auVar33 = vmaxss_avx(ZEXT416((uint)fVar23),ZEXT816(0) << 0x40);
          auVar30 = vshufps_avx(auVar33,auVar33,0);
          auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
          auVar33 = vshufps_avx(auVar33,auVar33,0);
          auVar45._0_4_ = auVar30._0_4_ * local_58.m128[0] + auVar33._0_4_ * local_128.m128[0];
          auVar45._4_4_ = auVar30._4_4_ * local_58.m128[1] + auVar33._4_4_ * local_128.m128[1];
          auVar45._8_4_ = auVar30._8_4_ * local_58.m128[2] + auVar33._8_4_ * local_128.m128[2];
          auVar45._12_4_ = auVar30._12_4_ * local_58.m128[3] + auVar33._12_4_ * local_128.m128[3];
          auVar39._0_4_ = auVar30._0_4_ * local_48 + auVar33._0_4_ * local_118;
          auVar39._4_4_ = auVar30._4_4_ * fStack_44 + auVar33._4_4_ * fStack_114;
          auVar39._8_4_ = auVar30._8_4_ * fStack_40 + auVar33._8_4_ * fStack_110;
          auVar39._12_4_ = auVar30._12_4_ * fStack_3c + auVar33._12_4_ * fStack_10c;
          auVar33 = vmaxss_avx(ZEXT416((uint)(fVar28 - fVar34)),ZEXT816(0) << 0x40);
          auVar30 = vshufps_avx(auVar33,auVar33,0);
          auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
          auVar33 = vshufps_avx(auVar33,auVar33,0);
          auVar31._0_4_ = auVar30._0_4_ * local_78.m128[0] + auVar33._0_4_ * local_148.m128[0];
          auVar31._4_4_ = auVar30._4_4_ * local_78.m128[1] + auVar33._4_4_ * local_148.m128[1];
          auVar31._8_4_ = auVar30._8_4_ * local_78.m128[2] + auVar33._8_4_ * local_148.m128[2];
          auVar31._12_4_ = auVar30._12_4_ * local_78.m128[3] + auVar33._12_4_ * local_148.m128[3];
          auVar35._0_4_ = auVar30._0_4_ * local_68 + auVar33._0_4_ * local_138;
          auVar35._4_4_ = auVar30._4_4_ * fStack_64 + auVar33._4_4_ * fStack_134;
          auVar35._8_4_ = auVar30._8_4_ * fStack_60 + auVar33._8_4_ * fStack_130;
          auVar35._12_4_ = auVar30._12_4_ * fStack_5c + auVar33._12_4_ * fStack_12c;
          if ((int)(uVar14 + 1) < iVar22) {
            itime = (size_t)(uVar14 + 1);
            iVar22 = ~uVar14 + iVar22;
            do {
              auVar26._0_4_ = ((float)(int)itime / fVar1 - fVar29) / (fVar24 - fVar29);
              auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar33 = vshufps_avx(auVar26,auVar26,0);
              fVar23 = auVar31._4_4_;
              fVar34 = auVar31._8_4_;
              fVar28 = auVar31._12_4_;
              auVar30 = vshufps_avx(ZEXT416((uint)(1.0 - auVar26._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar26._0_4_)),0);
              fVar47 = auVar45._4_4_;
              fVar48 = auVar45._8_4_;
              fVar49 = auVar45._12_4_;
              fVar36 = auVar35._4_4_;
              fVar37 = auVar35._8_4_;
              fVar38 = auVar35._12_4_;
              fVar41 = auVar39._4_4_;
              fVar42 = auVar39._8_4_;
              fVar43 = auVar39._12_4_;
              local_a8 = auVar35._0_4_ * auVar33._0_4_ + auVar39._0_4_ * auVar30._0_4_;
              fStack_a4 = fVar36 * auVar33._4_4_ + fVar41 * auVar30._4_4_;
              fStack_a0 = fVar37 * auVar33._8_4_ + fVar42 * auVar30._8_4_;
              fStack_9c = fVar38 * auVar33._12_4_ + fVar43 * auVar30._12_4_;
              ::anon_func::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_160,itime);
              auVar12._4_4_ = fVar23 * auVar33._4_4_ + fVar47 * auVar30._4_4_;
              auVar12._0_4_ = auVar31._0_4_ * auVar33._0_4_ + auVar45._0_4_ * auVar30._0_4_;
              auVar12._8_4_ = fVar34 * auVar33._8_4_ + fVar48 * auVar30._8_4_;
              auVar12._12_4_ = fVar28 * auVar33._12_4_ + fVar49 * auVar30._12_4_;
              auVar33 = vsubps_avx((undefined1  [16])local_98,auVar12);
              auVar13._4_4_ = fStack_a4;
              auVar13._0_4_ = local_a8;
              auVar13._8_4_ = fStack_a0;
              auVar13._12_4_ = fStack_9c;
              auVar25 = vsubps_avx(local_88,auVar13);
              auVar30 = vminps_avx(auVar33,ZEXT816(0) << 0x40);
              auVar33 = vmaxps_avx(auVar25,ZEXT816(0) << 0x40);
              auVar45._0_4_ = auVar45._0_4_ + auVar30._0_4_;
              auVar45._4_4_ = fVar47 + auVar30._4_4_;
              auVar45._8_4_ = fVar48 + auVar30._8_4_;
              auVar45._12_4_ = fVar49 + auVar30._12_4_;
              auVar31._0_4_ = auVar31._0_4_ + auVar30._0_4_;
              auVar31._4_4_ = fVar23 + auVar30._4_4_;
              auVar31._8_4_ = fVar34 + auVar30._8_4_;
              auVar31._12_4_ = fVar28 + auVar30._12_4_;
              auVar39._0_4_ = auVar39._0_4_ + auVar33._0_4_;
              auVar39._4_4_ = fVar41 + auVar33._4_4_;
              auVar39._8_4_ = fVar42 + auVar33._8_4_;
              auVar39._12_4_ = fVar43 + auVar33._12_4_;
              auVar35._0_4_ = auVar35._0_4_ + auVar33._0_4_;
              auVar35._4_4_ = fVar36 + auVar33._4_4_;
              auVar35._8_4_ = fVar37 + auVar33._8_4_;
              auVar35._12_4_ = fVar38 + auVar33._12_4_;
              itime = itime + 1;
              iVar22 = iVar22 + -1;
            } while (iVar22 != 0);
          }
        }
        aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar45,ZEXT416(geomID),0x30);
        uVar14 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.numTimeSteps - 1;
        uVar15 = (ulong)uVar14;
        BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar27._8_8_ = 0;
        auVar27._0_4_ = BVar2.lower;
        auVar27._4_4_ = BVar2.upper;
        aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar39,ZEXT416((uint)uVar21),0x30);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar31,ZEXT416(uVar14),0x30);
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar35,ZEXT416(uVar14),0x30);
        auVar30 = vcmpps_avx(local_1a8,auVar27,1);
        auVar25 = vinsertps_avx(local_1a8,auVar27,0x50);
        auVar33 = vblendps_avx(auVar27,local_1a8,2);
        local_1a8 = vblendvps_avx(auVar33,auVar25,auVar30);
        auVar32._0_4_ = aVar8.x * 0.5 + aVar10.x * 0.5 + aVar9.x * 0.5 + aVar11.x * 0.5;
        auVar32._4_4_ = aVar8.y * 0.5 + aVar10.y * 0.5 + aVar9.y * 0.5 + aVar11.y * 0.5;
        auVar32._8_4_ = aVar8.z * 0.5 + aVar10.z * 0.5 + aVar9.z * 0.5 + aVar11.z * 0.5;
        auVar32._12_4_ =
             aVar8.field_3.w * 0.5 + aVar10.field_3.w * 0.5 +
             aVar9.field_3.w * 0.5 + aVar11.field_3.w * 0.5;
        auVar33 = vminps_avx(local_d8,auVar32);
        auVar53 = ZEXT1664(auVar33);
        auVar33 = vmaxps_avx(local_e8,auVar32);
        auVar56 = ZEXT1664(auVar33);
        local_1f0 = local_1f0 + 1;
        local_1e8 = local_1e8 + uVar15;
        auVar33 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar16 >> 8),local_218 < uVar15)),0x50);
        auVar33 = vpslld_avx(auVar33,0x1f);
        local_1b8 = vblendvps_avx(local_1b8,auVar27,auVar33);
        auVar33 = vminps_avx(local_c8,(undefined1  [16])aVar8);
        auVar50 = ZEXT1664(auVar33);
        if (local_218 <= uVar15) {
          local_218 = uVar15;
        }
        pPVar7 = prims->items;
        pPVar7[k].lbounds.bounds0.lower.field_0.field_1 = aVar8;
        auVar33 = vmaxps_avx(local_b8,(undefined1  [16])aVar9);
        auVar46 = ZEXT1664(auVar33);
        pPVar7[k].lbounds.bounds0.upper.field_0.field_1 = aVar9;
        auVar33 = vminps_avx(local_108,(undefined1  [16])aVar10);
        auVar60 = ZEXT1664(auVar33);
        pPVar7[k].lbounds.bounds1.lower.field_0.field_1 = aVar10;
        auVar33 = vmaxps_avx(local_f8,(undefined1  [16])aVar11);
        auVar58 = ZEXT1664(auVar33);
        pPVar7[k].lbounds.bounds1.upper.field_0.field_1 = aVar11;
        pPVar7[k].time_range = BVar2;
        k = k + 1;
        uVar15 = r->_end;
      }
LAB_0122556c:
      aVar54 = auVar46._0_16_;
      aVar51 = auVar50._0_16_;
      uVar21 = uVar21 + 1;
    } while (uVar21 < uVar15);
    (__return_storage_ptr__->object_range)._end = local_1f0;
    aVar59 = auVar60._0_16_;
    aVar57 = auVar58._0_16_;
    aVar52 = auVar53._0_16_;
    aVar55 = auVar56._0_16_;
  }
  else {
    local_1a8 = SUB6416(ZEXT464(0x3f800000),0);
    local_1b8 = ZEXT816(0x3f80000000000000);
    aVar51.m128[2] = INFINITY;
    aVar51._0_8_ = 0x7f8000007f800000;
    aVar51.m128[3] = INFINITY;
    aVar54.m128[2] = -INFINITY;
    aVar54._0_8_ = 0xff800000ff800000;
    aVar54.m128[3] = -INFINITY;
    local_218 = 0;
    local_1e8 = 0;
    aVar59 = aVar51;
    aVar57 = aVar54;
    aVar52 = aVar51;
    aVar55 = aVar54;
  }
  auVar33 = vmovlhps_avx(local_1b8,local_1a8);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar51;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar54;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar59;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar57;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar52;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar55;
  __return_storage_ptr__->num_time_segments = local_1e8;
  __return_storage_ptr__->max_num_time_segments = local_218;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar33._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar33._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar33._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar33._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }